

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Library::SetProperty(Library *this,String *name,Variant *value)

{
  bool bVar1;
  element_type *this_00;
  pointer ppVar2;
  RuntimeID id;
  undefined1 local_60 [8];
  shared_ptr<Jinx::Impl::Runtime> runtime;
  _Self local_48 [3];
  _Self local_30;
  iterator itr;
  lock_guard<std::mutex> lock;
  Variant *value_local;
  String *name_local;
  Library *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->m_propertyMutex);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
       ::find(&this->m_propertyNameTable,name);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
       ::end(&this->m_propertyNameTable);
  bVar1 = std::operator==(&local_30,local_48);
  if (bVar1) {
    runtime.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  else {
    std::weak_ptr<Jinx::Impl::Runtime>::lock((weak_ptr<Jinx::Impl::Runtime> *)local_60);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_60);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>_>
               ::operator->(&local_30);
      id = PropertyName::GetId(&ppVar2->second);
      Runtime::SetProperty(this_00,id,value);
    }
    runtime.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _5_3_ = 0;
    runtime.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_1_ = !bVar1;
    std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr((shared_ptr<Jinx::Impl::Runtime> *)local_60);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  return;
}

Assistant:

inline_t void Library::SetProperty(const String & name, const Variant & value)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto itr = m_propertyNameTable.find(name);
		if (itr == m_propertyNameTable.end())
			return;
		auto runtime = m_runtime.lock();
		if (!runtime)
			return;
		runtime->SetProperty(itr->second.GetId(), value);
	}